

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * libDAI::min<double>(TProb<double> *a,TProb<double> *b)

{
  size_t sVar1;
  double *pdVar2;
  TProb<double> *in_RDI;
  double dVar3;
  double dVar4;
  size_t i;
  TProb<double> *result;
  double in_stack_ffffffffffffffa8;
  TProb<double> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffd8;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar7;
  
  uVar7 = 0;
  TProb<double>::size((TProb<double> *)0xb134ff);
  TProb<double>::TProb
            ((TProb<double> *)CONCAT17(uVar7,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  uVar5 = 0;
  while (uVar6 = uVar5, sVar1 = TProb<double>::size((TProb<double> *)0xb13529), uVar5 < sVar1) {
    dVar3 = TProb<double>::operator[](in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    dVar4 = TProb<double>::operator[](in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    if (dVar4 <= dVar3) {
      in_stack_ffffffffffffffa8 =
           TProb<double>::operator[](in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      pdVar2 = TProb<double>::operator[]
                         (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      *pdVar2 = in_stack_ffffffffffffffa8;
    }
    else {
      in_stack_ffffffffffffffb0 =
           (TProb<double> *)
           TProb<double>::operator[](in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      pdVar2 = TProb<double>::operator[]
                         (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      *pdVar2 = (double)in_stack_ffffffffffffffb0;
    }
    uVar5 = uVar6 + 1;
  }
  return in_RDI;
}

Assistant:

TProb<T> min( const TProb<T> &a, const TProb<T> &b ) {
        assert( a.size() == b.size() );
        TProb<T> result( a.size() );
        for( size_t i = 0; i < a.size(); i++ )
            if( a[i] < b[i] )
                result[i] = a[i];
            else
                result[i] = b[i];
        return result;
    }